

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O0

void __thiscall
cfd::core::TaprootScriptTree::TaprootScriptTree
          (TaprootScriptTree *this,uint8_t leaf_version,Script *script)

{
  bool bVar1;
  undefined8 uVar2;
  string *message;
  CfdError error_code;
  undefined6 in_stack_ffffffffffffff90;
  undefined1 uVar3;
  allocator in_stack_ffffffffffffff97;
  string local_68 [32];
  CfdSourceLocation local_48;
  Script *local_20;
  Script *script_local;
  TaprootScriptTree *pTStack_10;
  uint8_t leaf_version_local;
  TaprootScriptTree *this_local;
  
  local_20 = script;
  script_local._7_1_ = leaf_version;
  pTStack_10 = this;
  TapBranch::TapBranch(&this->super_TapBranch);
  (this->super_TapBranch)._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_009f8320;
  message = (string *)&this->nodes_;
  ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)message);
  (this->super_TapBranch).has_leaf_ = true;
  (this->super_TapBranch).leaf_version_ = script_local._7_1_;
  Script::operator=(&(this->super_TapBranch).script_,local_20);
  error_code = (CfdError)((ulong)this >> 0x20);
  bVar1 = TaprootUtil::IsValidLeafVersion(script_local._7_1_);
  if (!bVar1) {
    local_48.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_taproot.cpp"
                 ,0x2f);
    local_48.filename = local_48.filename + 1;
    local_48.line = 0x1cf;
    local_48.funcname = "TaprootScriptTree";
    logger::warn<unsigned_char&>
              (&local_48,"Unsupported leaf version. [{}]",(uchar *)((long)&script_local + 7));
    uVar3 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_68,"Unsupported leaf version.",(allocator *)&stack0xffffffffffffff97);
    CfdException::CfdException
              ((CfdException *)
               CONCAT17(in_stack_ffffffffffffff97,CONCAT16(uVar3,in_stack_ffffffffffffff90)),
               error_code,message);
    __cxa_throw(uVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  return;
}

Assistant:

TaprootScriptTree::TaprootScriptTree(
    uint8_t leaf_version, const Script& script)
    : TapBranch() {
  has_leaf_ = true;
  leaf_version_ = leaf_version;
  script_ = script;
  if (!TaprootUtil::IsValidLeafVersion(leaf_version)) {
    warn(CFD_LOG_SOURCE, "Unsupported leaf version. [{}]", leaf_version);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Unsupported leaf version.");
  }
}